

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_root.h
# Opt level: O2

void __thiscall fructose::test_base<TestAmsRouter>::test_base(test_base<TestAmsRouter> *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_test_root).m_verbose = false;
  (this->super_test_root).m_stop_on_failure = false;
  (this->super_test_root).m_reverse_mode = false;
  *(undefined8 *)&(this->super_test_root).m_error_count = 0;
  *(undefined8 *)((long)&(this->super_test_root).m_current_test_info + 2) = 0;
  (this->super_test_root)._vptr_test_root = (_func_int **)&PTR__test_base_0011bac0;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_tests)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_available_tests).
  super__Vector_base<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_available_tests).
  super__Vector_base<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_available_tests).
  super__Vector_base<fructose::test_root::test_info,_std::allocator<fructose::test_root::test_info>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_exceptionPending)._M_dataplus._M_p = (pointer)&(this->m_exceptionPending).field_2;
  (this->m_exceptionPending)._M_string_length = 0;
  (this->m_exceptionPending).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

inline
test_root::test_root()
    : m_verbose(false)
    , m_stop_on_failure(false)
    , m_reverse_mode(false)
    , m_error_count(0)
    , m_current_test_info(0)
    , m_exception_happened(false)
    , m_assertion_tested(false)
{
}